

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  uint uVar3;
  BVH *bvh;
  size_t sVar4;
  Scene *pSVar5;
  float *pfVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  float *vertices;
  long lVar30;
  ulong uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  size_t sVar33;
  size_t sVar34;
  uint uVar35;
  NodeRef *pNVar36;
  NodeRef root;
  long lVar37;
  long lVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar53;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 in_ZMM0 [64];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar74 [64];
  float fVar79;
  float fVar102;
  float fVar103;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar104;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar105;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar107;
  float fVar121;
  float fVar122;
  undefined1 auVar108 [16];
  float fVar124;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar123;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar136;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar137;
  float fVar153;
  float fVar154;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar155;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar179;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar180;
  undefined1 auVar174 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar185 [16];
  float fVar194;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar195;
  float fVar196;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar206;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar214;
  float fVar216;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar215;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar224 [64];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [64];
  float fVar234;
  float fVar238;
  float fVar239;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  undefined1 auVar237 [16];
  Precalculations pre;
  undefined1 local_1af8 [8];
  float fStack_1af0;
  float fStack_1aec;
  undefined1 local_1ae8 [16];
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a88 [16];
  RayK<4> *local_1a70;
  vbool<4> terminated;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  undefined1 local_1a48 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1928;
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  uint local_18b8;
  uint uStack_18b4;
  uint uStack_18b0;
  uint uStack_18ac;
  uint uStack_18a8;
  uint uStack_18a4;
  uint uStack_18a0;
  uint uStack_189c;
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar25 = mm_lookupmask_ps._248_8_;
  uVar24 = mm_lookupmask_ps._240_8_;
  uVar23 = mm_lookupmask_ps._8_8_;
  uVar22 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar71 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar71,(undefined1  [16])valid_i->field_0);
    auVar112 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar112,5);
    auVar111 = auVar72 & auVar10;
    if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar111[0xf] < '\0'
       ) {
      auVar10 = vandps_avx(auVar10,auVar72);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar185._8_4_ = 0x7fffffff;
      auVar185._0_8_ = 0x7fffffff7fffffff;
      auVar185._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar185,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar111 = vcmpps_avx(auVar72,auVar197,1);
      auVar219._8_4_ = 0x3f800000;
      auVar219._0_8_ = 0x3f8000003f800000;
      auVar219._12_4_ = 0x3f800000;
      auVar156 = vdivps_avx(auVar219,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72 = vandps_avx(auVar185,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar138 = vcmpps_avx(auVar72,auVar197,1);
      auVar157 = vdivps_avx(auVar219,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vandps_avx(auVar185,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar197,1);
      auVar198._8_4_ = 0x5d5e0b6b;
      auVar198._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar198._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar156,auVar198,auVar111);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar157,auVar198,auVar138);
      auVar111 = vdivps_avx(auVar219,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar111,auVar198,auVar72)
      ;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar112,1);
      auVar156._8_4_ = 0x10;
      auVar156._0_8_ = 0x1000000010;
      auVar156._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar156);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar112,5);
      auVar111._8_4_ = 0x20;
      auVar111._0_8_ = 0x2000000020;
      auVar111._12_4_ = 0x20;
      auVar157._8_4_ = 0x30;
      auVar157._0_8_ = 0x3000000030;
      auVar157._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar157,auVar111,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar112,5);
      auVar138._8_4_ = 0x40;
      auVar138._0_8_ = 0x4000000040;
      auVar138._12_4_ = 0x40;
      auVar158._8_4_ = 0x50;
      auVar158._0_8_ = 0x5000000050;
      auVar158._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar158,auVar138,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar112);
      auVar111 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar112);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar222 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar72,auVar10);
      auVar74 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar111,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar71._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar71._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar71._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar71._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1a70 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_00ec1a09:
      do {
        do {
          root.ptr = pNVar36[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec2f6a;
          pNVar36 = pNVar36 + -1;
          paVar32 = paVar32 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar230 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar71 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar27 = vmovmskps_avx(auVar71);
        } while (uVar27 == 0);
        uVar31 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar35 < uVar27) {
LAB_00ec1a48:
          do {
            iVar29 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec2f6a;
              auVar71 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar230._0_16_,6);
              if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar71[0xf]) goto LAB_00ec1a09;
              auVar71 = vpcmpeqd_avx(auVar71,auVar71);
              lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              lVar30 = 0;
              local_1a48 = auVar71 ^ (undefined1  [16])terminated.field_0;
              goto LAB_00ec1c37;
            }
            sVar34 = 8;
            auVar71 = auVar222._0_16_;
            for (lVar30 = 0;
                (auVar230 = ZEXT1664(auVar71), lVar30 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar30 * 8), sVar4 != 8));
                lVar30 = lVar30 + 1) {
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar30 * 4);
              auVar40._4_4_ = uVar28;
              auVar40._0_4_ = uVar28;
              auVar40._8_4_ = uVar28;
              auVar40._12_4_ = uVar28;
              auVar11._8_8_ = tray.org.field_0._8_8_;
              auVar11._0_8_ = tray.org.field_0._0_8_;
              auVar12._8_8_ = tray.org.field_0._24_8_;
              auVar12._0_8_ = tray.org.field_0._16_8_;
              auVar13._8_8_ = tray.org.field_0._40_8_;
              auVar13._0_8_ = tray.org.field_0._32_8_;
              auVar72 = vsubps_avx(auVar40,auVar11);
              auVar139._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar72._0_4_;
              auVar139._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar72._4_4_;
              auVar139._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar72._8_4_;
              auVar139._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar72._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar30 * 4);
              auVar41._4_4_ = uVar28;
              auVar41._0_4_ = uVar28;
              auVar41._8_4_ = uVar28;
              auVar41._12_4_ = uVar28;
              auVar72 = vsubps_avx(auVar41,auVar12);
              auVar167._0_4_ = tray.rdir.field_0._16_4_ * auVar72._0_4_;
              auVar167._4_4_ = tray.rdir.field_0._20_4_ * auVar72._4_4_;
              auVar167._8_4_ = tray.rdir.field_0._24_4_ * auVar72._8_4_;
              auVar167._12_4_ = tray.rdir.field_0._28_4_ * auVar72._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar30 * 4);
              auVar42._4_4_ = uVar28;
              auVar42._0_4_ = uVar28;
              auVar42._8_4_ = uVar28;
              auVar42._12_4_ = uVar28;
              auVar72 = vsubps_avx(auVar42,auVar13);
              auVar199._0_4_ = tray.rdir.field_0._32_4_ * auVar72._0_4_;
              auVar199._4_4_ = tray.rdir.field_0._36_4_ * auVar72._4_4_;
              auVar199._8_4_ = tray.rdir.field_0._40_4_ * auVar72._8_4_;
              auVar199._12_4_ = tray.rdir.field_0._44_4_ * auVar72._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar30 * 4);
              auVar43._4_4_ = uVar28;
              auVar43._0_4_ = uVar28;
              auVar43._8_4_ = uVar28;
              auVar43._12_4_ = uVar28;
              auVar72 = vsubps_avx(auVar43,auVar11);
              auVar55._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar72._0_4_;
              auVar55._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar72._4_4_;
              auVar55._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar72._8_4_;
              auVar55._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar72._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar30 * 4);
              auVar44._4_4_ = uVar28;
              auVar44._0_4_ = uVar28;
              auVar44._8_4_ = uVar28;
              auVar44._12_4_ = uVar28;
              auVar72 = vsubps_avx(auVar44,auVar12);
              auVar80._0_4_ = tray.rdir.field_0._16_4_ * auVar72._0_4_;
              auVar80._4_4_ = tray.rdir.field_0._20_4_ * auVar72._4_4_;
              auVar80._8_4_ = tray.rdir.field_0._24_4_ * auVar72._8_4_;
              auVar80._12_4_ = tray.rdir.field_0._28_4_ * auVar72._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar30 * 4);
              auVar45._4_4_ = uVar28;
              auVar45._0_4_ = uVar28;
              auVar45._8_4_ = uVar28;
              auVar45._12_4_ = uVar28;
              auVar72 = vsubps_avx(auVar45,auVar13);
              auVar108._0_4_ = tray.rdir.field_0._32_4_ * auVar72._0_4_;
              auVar108._4_4_ = tray.rdir.field_0._36_4_ * auVar72._4_4_;
              auVar108._8_4_ = tray.rdir.field_0._40_4_ * auVar72._8_4_;
              auVar108._12_4_ = tray.rdir.field_0._44_4_ * auVar72._12_4_;
              auVar72 = vminps_avx(auVar139,auVar55);
              auVar111 = vminps_avx(auVar167,auVar80);
              auVar72 = vmaxps_avx(auVar72,auVar111);
              auVar111 = vminps_avx(auVar199,auVar108);
              auVar72 = vmaxps_avx(auVar72,auVar111);
              auVar46._0_4_ = auVar224._0_4_ * auVar72._0_4_;
              auVar46._4_4_ = auVar224._4_4_ * auVar72._4_4_;
              auVar46._8_4_ = auVar224._8_4_ * auVar72._8_4_;
              auVar46._12_4_ = auVar224._12_4_ * auVar72._12_4_;
              auVar72 = vmaxps_avx(auVar139,auVar55);
              auVar111 = vmaxps_avx(auVar167,auVar80);
              auVar111 = vminps_avx(auVar72,auVar111);
              auVar72 = vmaxps_avx(auVar199,auVar108);
              auVar72 = vminps_avx(auVar111,auVar72);
              auVar56._0_4_ = auVar228._0_4_ * auVar72._0_4_;
              auVar56._4_4_ = auVar228._4_4_ * auVar72._4_4_;
              auVar56._8_4_ = auVar228._8_4_ * auVar72._8_4_;
              auVar56._12_4_ = auVar228._12_4_ * auVar72._12_4_;
              auVar72 = vmaxps_avx(auVar46,(undefined1  [16])tray.tnear.field_0);
              auVar111 = vminps_avx(auVar56,(undefined1  [16])tray.tfar.field_0);
              auVar111 = vcmpps_avx(auVar72,auVar111,2);
              auVar74 = ZEXT1664(auVar111);
              sVar33 = sVar34;
              auVar72 = auVar71;
              if (((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar111[0xf] < '\0') &&
                 (auVar72 = vblendvps_avx(auVar222._0_16_,auVar46,auVar111), sVar33 = sVar4,
                 sVar34 != 8)) {
                pNVar36->ptr = sVar34;
                pNVar36 = pNVar36 + 1;
                *(undefined1 (*) [16])paVar32->v = auVar71;
                paVar32 = paVar32 + 1;
              }
              auVar71 = auVar72;
              sVar34 = sVar33;
            }
            if (sVar34 == 8) goto LAB_00ec1bcb;
            auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar71,6);
            uVar28 = vmovmskps_avx(auVar72);
            root.ptr = sVar34;
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar28));
          pNVar36->ptr = sVar34;
          pNVar36 = pNVar36 + 1;
          *(undefined1 (*) [16])paVar32->v = auVar71;
          paVar32 = paVar32 + 1;
        }
        else {
          while (uVar31 != 0) {
            sVar34 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> sVar34 & 1) == 0; sVar34 = sVar34 + 1) {
              }
            }
            uVar31 = uVar31 & uVar31 - 1;
            auVar74 = ZEXT1664(auVar74._0_16_);
            bVar26 = occluded1(This,bvh,root,sVar34,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[sVar34] = -1;
            }
          }
          auVar71 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar230 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar71[0xf] < '\0') {
            auVar74 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar71._8_4_ = 0xff800000;
            auVar71._0_8_ = 0xff800000ff800000;
            auVar71._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar71,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar35 < uVar27) goto LAB_00ec1a48;
        }
LAB_00ec1bcb:
      } while (iVar29 != 3);
LAB_00ec2f6a:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar73);
      *(undefined1 (*) [16])local_1a70 = auVar10;
    }
  }
  return;
LAB_00ec1c37:
  do {
    lVar38 = -0x10;
    auVar71 = auVar74._0_16_;
    if (lVar30 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    pSVar5 = context->scene;
    local_1ae8 = local_1a48;
    do {
      if ((lVar38 == 0) || (uVar27 = *(uint *)(lVar37 + 0x10 + lVar38), uVar27 == 0xffffffff))
      break;
      uVar3 = *(uint *)(lVar37 + lVar38);
      pfVar6 = (pSVar5->vertices).items[uVar3];
      uVar31 = (ulong)*(uint *)(lVar37 + -0x40 + lVar38);
      fVar166 = pfVar6[uVar31];
      auVar125._4_4_ = fVar166;
      auVar125._0_4_ = fVar166;
      auVar125._8_4_ = fVar166;
      auVar125._12_4_ = fVar166;
      fVar166 = pfVar6[uVar31 + 1];
      auVar112._4_4_ = fVar166;
      auVar112._0_4_ = fVar166;
      auVar112._8_4_ = fVar166;
      auVar112._12_4_ = fVar166;
      fVar166 = pfVar6[uVar31 + 2];
      auVar81._4_4_ = fVar166;
      auVar81._0_4_ = fVar166;
      auVar81._8_4_ = fVar166;
      auVar81._12_4_ = fVar166;
      uVar31 = (ulong)*(uint *)(lVar37 + -0x10 + lVar38);
      fVar166 = pfVar6[uVar31];
      auVar235._4_4_ = fVar166;
      auVar235._0_4_ = fVar166;
      auVar235._8_4_ = fVar166;
      auVar235._12_4_ = fVar166;
      fVar166 = pfVar6[uVar31 + 1];
      auVar140._4_4_ = fVar166;
      auVar140._0_4_ = fVar166;
      auVar140._8_4_ = fVar166;
      auVar140._12_4_ = fVar166;
      fVar166 = pfVar6[uVar31 + 2];
      auVar168._4_4_ = fVar166;
      auVar168._0_4_ = fVar166;
      auVar168._8_4_ = fVar166;
      auVar168._12_4_ = fVar166;
      auVar71 = *(undefined1 (*) [16])(ray + 0x10);
      auVar72 = *(undefined1 (*) [16])(ray + 0x20);
      auVar112 = vsubps_avx(auVar112,auVar71);
      auVar138 = vsubps_avx(auVar81,auVar72);
      auVar156 = vsubps_avx(auVar140,auVar71);
      auVar157 = vsubps_avx(auVar168,auVar72);
      auVar111 = vsubps_avx(auVar156,auVar112);
      auVar158 = vsubps_avx(auVar157,auVar138);
      fVar9 = auVar112._0_4_;
      fVar166 = auVar156._0_4_ + fVar9;
      fVar107 = auVar112._4_4_;
      fVar175 = auVar156._4_4_ + fVar107;
      fVar77 = auVar112._8_4_;
      fVar176 = auVar156._8_4_ + fVar77;
      fVar123 = auVar112._12_4_;
      fVar179 = auVar156._12_4_ + fVar123;
      fVar223 = auVar138._0_4_;
      fVar183 = fVar223 + auVar157._0_4_;
      fVar226 = auVar138._4_4_;
      fVar190 = fVar226 + auVar157._4_4_;
      fVar229 = auVar138._8_4_;
      fVar192 = fVar229 + auVar157._8_4_;
      fVar232 = auVar138._12_4_;
      fVar194 = fVar232 + auVar157._12_4_;
      fVar54 = auVar158._0_4_;
      auVar141._0_4_ = fVar166 * fVar54;
      fVar76 = auVar158._4_4_;
      auVar141._4_4_ = fVar175 * fVar76;
      fVar180 = auVar158._8_4_;
      auVar141._8_4_ = fVar176 * fVar180;
      fVar215 = auVar158._12_4_;
      auVar141._12_4_ = fVar179 * fVar215;
      fVar75 = auVar111._0_4_;
      auVar200._0_4_ = fVar183 * fVar75;
      fVar78 = auVar111._4_4_;
      auVar200._4_4_ = fVar190 * fVar78;
      fVar208 = auVar111._8_4_;
      auVar200._8_4_ = fVar192 * fVar208;
      fVar217 = auVar111._12_4_;
      auVar200._12_4_ = fVar194 * fVar217;
      auVar158 = vsubps_avx(auVar200,auVar141);
      auVar111 = *(undefined1 (*) [16])ray;
      auVar185 = vsubps_avx(auVar125,auVar111);
      auVar197 = vsubps_avx(auVar235,auVar111);
      auVar198 = vsubps_avx(auVar197,auVar185);
      fVar184 = auVar198._0_4_;
      auVar186._0_4_ = fVar184 * fVar183;
      fVar191 = auVar198._4_4_;
      auVar186._4_4_ = fVar191 * fVar190;
      fVar193 = auVar198._8_4_;
      auVar186._8_4_ = fVar193 * fVar192;
      fVar195 = auVar198._12_4_;
      auVar186._12_4_ = fVar195 * fVar194;
      fVar183 = auVar185._0_4_;
      fVar207 = auVar197._0_4_ + fVar183;
      fVar190 = auVar185._4_4_;
      fVar214 = auVar197._4_4_ + fVar190;
      fVar192 = auVar185._8_4_;
      fVar216 = auVar197._8_4_ + fVar192;
      fVar194 = auVar185._12_4_;
      fVar218 = auVar197._12_4_ + fVar194;
      auVar236._0_4_ = fVar207 * fVar54;
      auVar236._4_4_ = fVar214 * fVar76;
      auVar236._8_4_ = fVar216 * fVar180;
      auVar236._12_4_ = fVar218 * fVar215;
      auVar198 = vsubps_avx(auVar236,auVar186);
      auVar187._0_4_ = fVar207 * fVar75;
      auVar187._4_4_ = fVar214 * fVar78;
      auVar187._8_4_ = fVar216 * fVar208;
      auVar187._12_4_ = fVar218 * fVar217;
      auVar169._0_4_ = fVar184 * fVar166;
      auVar169._4_4_ = fVar191 * fVar175;
      auVar169._8_4_ = fVar193 * fVar176;
      auVar169._12_4_ = fVar195 * fVar179;
      auVar219 = vsubps_avx(auVar169,auVar187);
      fVar175 = *(float *)(ray + 0x60);
      fVar176 = *(float *)(ray + 100);
      fVar179 = *(float *)(ray + 0x68);
      auVar20 = *(undefined1 (*) [12])(ray + 0x60);
      fVar207 = *(float *)(ray + 0x6c);
      fVar214 = *(float *)(ray + 0x50);
      fVar216 = *(float *)(ray + 0x54);
      fVar218 = *(float *)(ray + 0x58);
      auVar21 = *(undefined1 (*) [12])(ray + 0x50);
      fVar105 = *(float *)(ray + 0x5c);
      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
      fVar79 = *(float *)(ray + 0x4c);
      auVar209._0_4_ =
           auVar158._0_4_ * *(float *)(ray + 0x40) +
           auVar219._0_4_ * fVar175 + fVar214 * auVar198._0_4_;
      auVar209._4_4_ =
           auVar158._4_4_ * *(float *)(ray + 0x44) +
           auVar219._4_4_ * fVar176 + fVar216 * auVar198._4_4_;
      auVar209._8_4_ =
           auVar158._8_4_ * *(float *)(ray + 0x48) +
           auVar219._8_4_ * fVar179 + fVar218 * auVar198._8_4_;
      auVar209._12_4_ =
           auVar158._12_4_ * fVar79 + auVar219._12_4_ * fVar207 + fVar105 * auVar198._12_4_;
      uVar31 = (ulong)*(uint *)(lVar37 + -0x30 + lVar38);
      fVar166 = pfVar6[uVar31 + 1];
      auVar57._4_4_ = fVar166;
      auVar57._0_4_ = fVar166;
      auVar57._8_4_ = fVar166;
      auVar57._12_4_ = fVar166;
      auVar71 = vsubps_avx(auVar57,auVar71);
      fVar166 = pfVar6[uVar31 + 2];
      auVar82._4_4_ = fVar166;
      auVar82._0_4_ = fVar166;
      auVar82._8_4_ = fVar166;
      auVar82._12_4_ = fVar166;
      auVar72 = vsubps_avx(auVar82,auVar72);
      auVar112 = vsubps_avx(auVar112,auVar71);
      auVar138 = vsubps_avx(auVar138,auVar72);
      fVar39 = fVar9 + auVar71._0_4_;
      fVar51 = fVar107 + auVar71._4_4_;
      fVar52 = fVar77 + auVar71._8_4_;
      fVar53 = fVar123 + auVar71._12_4_;
      fVar106 = fVar223 + auVar72._0_4_;
      fVar121 = fVar226 + auVar72._4_4_;
      fVar122 = fVar229 + auVar72._8_4_;
      fVar124 = fVar232 + auVar72._12_4_;
      fVar234 = auVar138._0_4_;
      auVar159._0_4_ = fVar234 * fVar39;
      fVar238 = auVar138._4_4_;
      auVar159._4_4_ = fVar238 * fVar51;
      fVar239 = auVar138._8_4_;
      auVar159._8_4_ = fVar239 * fVar52;
      fVar240 = auVar138._12_4_;
      auVar159._12_4_ = fVar240 * fVar53;
      fVar196 = auVar112._0_4_;
      auVar170._0_4_ = fVar196 * fVar106;
      fVar204 = auVar112._4_4_;
      auVar170._4_4_ = fVar204 * fVar121;
      fVar205 = auVar112._8_4_;
      auVar170._8_4_ = fVar205 * fVar122;
      fVar206 = auVar112._12_4_;
      auVar170._12_4_ = fVar206 * fVar124;
      auVar112 = vsubps_avx(auVar170,auVar159);
      fVar166 = pfVar6[uVar31];
      auVar171._4_4_ = fVar166;
      auVar171._0_4_ = fVar166;
      auVar171._8_4_ = fVar166;
      auVar171._12_4_ = fVar166;
      auVar111 = vsubps_avx(auVar171,auVar111);
      auVar138 = vsubps_avx(auVar185,auVar111);
      fVar225 = auVar138._0_4_;
      auVar109._0_4_ = fVar225 * fVar106;
      fVar227 = auVar138._4_4_;
      auVar109._4_4_ = fVar227 * fVar121;
      fVar231 = auVar138._8_4_;
      auVar109._8_4_ = fVar231 * fVar122;
      fVar233 = auVar138._12_4_;
      auVar109._12_4_ = fVar233 * fVar124;
      fVar166 = fVar183 + auVar111._0_4_;
      fVar106 = fVar190 + auVar111._4_4_;
      fVar121 = fVar192 + auVar111._8_4_;
      fVar122 = fVar194 + auVar111._12_4_;
      auVar188._0_4_ = fVar166 * fVar234;
      auVar188._4_4_ = fVar106 * fVar238;
      auVar188._8_4_ = fVar121 * fVar239;
      auVar188._12_4_ = fVar122 * fVar240;
      auVar138 = vsubps_avx(auVar188,auVar109);
      auVar189._0_4_ = fVar166 * fVar196;
      auVar189._4_4_ = fVar106 * fVar204;
      auVar189._8_4_ = fVar121 * fVar205;
      auVar189._12_4_ = fVar122 * fVar206;
      auVar47._0_4_ = fVar225 * fVar39;
      auVar47._4_4_ = fVar227 * fVar51;
      auVar47._8_4_ = fVar231 * fVar52;
      auVar47._12_4_ = fVar233 * fVar53;
      auVar158 = vsubps_avx(auVar47,auVar189);
      local_1a58 = auVar19._0_4_;
      fStack_1a54 = auVar19._4_4_;
      fStack_1a50 = auVar19._8_4_;
      auVar126._0_4_ =
           local_1a58 * auVar112._0_4_ + fVar175 * auVar158._0_4_ + fVar214 * auVar138._0_4_;
      auVar126._4_4_ =
           fStack_1a54 * auVar112._4_4_ + fVar176 * auVar158._4_4_ + fVar216 * auVar138._4_4_;
      auVar126._8_4_ =
           fStack_1a50 * auVar112._8_4_ + fVar179 * auVar158._8_4_ + fVar218 * auVar138._8_4_;
      auVar126._12_4_ =
           fVar79 * auVar112._12_4_ + fVar207 * auVar158._12_4_ + fVar105 * auVar138._12_4_;
      auVar112 = vsubps_avx(auVar111,auVar197);
      fVar137 = auVar111._0_4_ + auVar197._0_4_;
      fVar153 = auVar111._4_4_ + auVar197._4_4_;
      fVar154 = auVar111._8_4_ + auVar197._8_4_;
      fVar155 = auVar111._12_4_ + auVar197._12_4_;
      auVar111 = vsubps_avx(auVar71,auVar156);
      fVar166 = auVar71._0_4_ + auVar156._0_4_;
      fVar106 = auVar71._4_4_ + auVar156._4_4_;
      fVar121 = auVar71._8_4_ + auVar156._8_4_;
      fVar122 = auVar71._12_4_ + auVar156._12_4_;
      auVar71 = vsubps_avx(auVar72,auVar157);
      fVar124 = auVar72._0_4_ + auVar157._0_4_;
      fVar102 = auVar72._4_4_ + auVar157._4_4_;
      fVar103 = auVar72._8_4_ + auVar157._8_4_;
      fVar104 = auVar72._12_4_ + auVar157._12_4_;
      fVar177 = auVar71._0_4_;
      auVar160._0_4_ = fVar177 * fVar166;
      fVar178 = auVar71._4_4_;
      auVar160._4_4_ = fVar178 * fVar106;
      fVar181 = auVar71._8_4_;
      auVar160._8_4_ = fVar181 * fVar121;
      fVar182 = auVar71._12_4_;
      auVar160._12_4_ = fVar182 * fVar122;
      fVar39 = auVar111._0_4_;
      auVar172._0_4_ = fVar39 * fVar124;
      fVar51 = auVar111._4_4_;
      auVar172._4_4_ = fVar51 * fVar102;
      fVar52 = auVar111._8_4_;
      auVar172._8_4_ = fVar52 * fVar103;
      fVar53 = auVar111._12_4_;
      auVar172._12_4_ = fVar53 * fVar104;
      auVar71 = vsubps_avx(auVar172,auVar160);
      fVar136 = auVar112._0_4_;
      auVar83._0_4_ = fVar136 * fVar124;
      fVar124 = auVar112._4_4_;
      auVar83._4_4_ = fVar124 * fVar102;
      fVar102 = auVar112._8_4_;
      auVar83._8_4_ = fVar102 * fVar103;
      fVar103 = auVar112._12_4_;
      auVar83._12_4_ = fVar103 * fVar104;
      auVar173._0_4_ = fVar177 * fVar137;
      auVar173._4_4_ = fVar178 * fVar153;
      auVar173._8_4_ = fVar181 * fVar154;
      auVar173._12_4_ = fVar182 * fVar155;
      auVar72 = vsubps_avx(auVar173,auVar83);
      auVar142._0_4_ = fVar137 * fVar39;
      auVar142._4_4_ = fVar153 * fVar51;
      auVar142._8_4_ = fVar154 * fVar52;
      auVar142._12_4_ = fVar155 * fVar53;
      auVar58._0_4_ = fVar136 * fVar166;
      auVar58._4_4_ = fVar124 * fVar106;
      auVar58._8_4_ = fVar102 * fVar121;
      auVar58._12_4_ = fVar103 * fVar122;
      auVar111 = vsubps_avx(auVar58,auVar142);
      auVar59._0_4_ =
           local_1a58 * auVar71._0_4_ + fVar175 * auVar111._0_4_ + fVar214 * auVar72._0_4_;
      auVar59._4_4_ =
           fStack_1a54 * auVar71._4_4_ + fVar176 * auVar111._4_4_ + fVar216 * auVar72._4_4_;
      auVar59._8_4_ =
           fStack_1a50 * auVar71._8_4_ + fVar179 * auVar111._8_4_ + fVar218 * auVar72._8_4_;
      auVar59._12_4_ =
           fVar79 * auVar71._12_4_ + fVar207 * auVar111._12_4_ + fVar105 * auVar72._12_4_;
      auVar201._0_4_ = auVar59._0_4_ + auVar209._0_4_ + auVar126._0_4_;
      auVar201._4_4_ = auVar59._4_4_ + auVar209._4_4_ + auVar126._4_4_;
      auVar201._8_4_ = auVar59._8_4_ + auVar209._8_4_ + auVar126._8_4_;
      auVar201._12_4_ = auVar59._12_4_ + auVar209._12_4_ + auVar126._12_4_;
      auVar71 = vminps_avx(auVar209,auVar126);
      auVar72 = vminps_avx(auVar71,auVar59);
      auVar143._8_4_ = 0x7fffffff;
      auVar143._0_8_ = 0x7fffffff7fffffff;
      auVar143._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx(auVar201,auVar143);
      auVar144._0_4_ = auVar71._0_4_ * 1.1920929e-07;
      auVar144._4_4_ = auVar71._4_4_ * 1.1920929e-07;
      auVar144._8_4_ = auVar71._8_4_ * 1.1920929e-07;
      auVar144._12_4_ = auVar71._12_4_ * 1.1920929e-07;
      uVar31 = CONCAT44(auVar144._4_4_,auVar144._0_4_);
      auVar161._0_8_ = uVar31 ^ 0x8000000080000000;
      auVar161._8_4_ = -auVar144._8_4_;
      auVar161._12_4_ = -auVar144._12_4_;
      auVar72 = vcmpps_avx(auVar72,auVar161,5);
      auVar111 = vmaxps_avx(auVar209,auVar126);
      auVar111 = vmaxps_avx(auVar111,auVar59);
      auVar111 = vcmpps_avx(auVar111,auVar144,2);
      auVar72 = vorps_avx(auVar72,auVar111);
      uVar31 = (ulong)*(uint *)(lVar37 + -0x20 + lVar38);
      auVar111 = local_1ae8 & auVar72;
      fVar166 = pfVar6[uVar31];
      fVar175 = pfVar6[uVar31 + 1];
      fVar176 = pfVar6[uVar31 + 2];
      if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar111[0xf]
         ) {
LAB_00ec2612:
        auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar60._0_4_ = fVar196 * fVar54;
        auVar60._4_4_ = fVar204 * fVar76;
        auVar60._8_4_ = fVar205 * fVar180;
        auVar60._12_4_ = fVar206 * fVar215;
        auVar84._0_4_ = fVar234 * fVar75;
        auVar84._4_4_ = fVar238 * fVar78;
        auVar84._8_4_ = fVar239 * fVar208;
        auVar84._12_4_ = fVar240 * fVar217;
        auVar138 = vsubps_avx(auVar84,auVar60);
        auVar145._0_4_ = fVar234 * fVar39;
        auVar145._4_4_ = fVar238 * fVar51;
        auVar145._8_4_ = fVar239 * fVar52;
        auVar145._12_4_ = fVar240 * fVar53;
        auVar162._0_4_ = fVar196 * fVar177;
        auVar162._4_4_ = fVar204 * fVar178;
        auVar162._8_4_ = fVar205 * fVar181;
        auVar162._12_4_ = fVar206 * fVar182;
        auVar156 = vsubps_avx(auVar162,auVar145);
        auVar111 = vandps_avx(auVar60,auVar143);
        auVar112 = vandps_avx(auVar145,auVar143);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        auVar61._0_4_ = fVar225 * fVar177;
        auVar61._4_4_ = fVar227 * fVar178;
        auVar61._8_4_ = fVar231 * fVar181;
        auVar61._12_4_ = fVar233 * fVar182;
        auVar85._0_4_ = fVar225 * fVar54;
        auVar85._4_4_ = fVar227 * fVar76;
        auVar85._8_4_ = fVar231 * fVar180;
        auVar85._12_4_ = fVar233 * fVar215;
        auVar146._0_4_ = fVar184 * fVar234;
        auVar146._4_4_ = fVar191 * fVar238;
        auVar146._8_4_ = fVar193 * fVar239;
        auVar146._12_4_ = fVar195 * fVar240;
        auVar138 = vsubps_avx(auVar85,auVar146);
        auVar163._0_4_ = fVar234 * fVar136;
        auVar163._4_4_ = fVar238 * fVar124;
        auVar163._8_4_ = fVar239 * fVar102;
        auVar163._12_4_ = fVar240 * fVar103;
        auVar156 = vsubps_avx(auVar163,auVar61);
        auVar111 = vandps_avx(auVar146,auVar143);
        auVar112 = vandps_avx(auVar61,auVar143);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        auVar62._0_4_ = fVar196 * fVar136;
        auVar62._4_4_ = fVar204 * fVar124;
        auVar62._8_4_ = fVar205 * fVar102;
        auVar62._12_4_ = fVar206 * fVar103;
        auVar86._0_4_ = fVar184 * fVar196;
        auVar86._4_4_ = fVar191 * fVar204;
        auVar86._8_4_ = fVar193 * fVar205;
        auVar86._12_4_ = fVar195 * fVar206;
        auVar110._0_4_ = fVar225 * fVar75;
        auVar110._4_4_ = fVar227 * fVar78;
        auVar110._8_4_ = fVar231 * fVar208;
        auVar110._12_4_ = fVar233 * fVar217;
        auVar48._0_4_ = fVar225 * fVar39;
        auVar48._4_4_ = fVar227 * fVar51;
        auVar48._8_4_ = fVar231 * fVar52;
        auVar48._12_4_ = fVar233 * fVar53;
        auVar138 = vsubps_avx(auVar86,auVar110);
        auVar156 = vsubps_avx(auVar48,auVar62);
        auVar111 = vandps_avx(auVar110,auVar143);
        auVar112 = vandps_avx(auVar62,auVar143);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        local_1af8._0_4_ = auVar20._0_4_;
        local_1af8._4_4_ = auVar20._4_4_;
        fStack_1af0 = auVar20._8_4_;
        local_1ac8 = auVar21._0_4_;
        fStack_1ac4 = auVar21._4_4_;
        fStack_1ac0 = auVar21._8_4_;
        fVar54 = local_1a58 * local_1928._0_4_ +
                 local_1928._32_4_ * (float)local_1af8._0_4_ + local_1928._16_4_ * local_1ac8;
        fVar75 = fStack_1a54 * local_1928._4_4_ +
                 local_1928._36_4_ * (float)local_1af8._4_4_ + local_1928._20_4_ * fStack_1ac4;
        fVar76 = fStack_1a50 * local_1928._8_4_ +
                 local_1928._40_4_ * fStack_1af0 + local_1928._24_4_ * fStack_1ac0;
        fVar78 = fVar79 * local_1928._12_4_ +
                 local_1928._44_4_ * fVar207 + local_1928._28_4_ * fVar105;
        auVar87._0_4_ = fVar54 + fVar54;
        auVar87._4_4_ = fVar75 + fVar75;
        auVar87._8_4_ = fVar76 + fVar76;
        auVar87._12_4_ = fVar78 + fVar78;
        fVar54 = local_1928._0_4_ * fVar183 +
                 local_1928._32_4_ * fVar223 + local_1928._16_4_ * fVar9;
        fVar75 = local_1928._4_4_ * fVar190 +
                 local_1928._36_4_ * fVar226 + local_1928._20_4_ * fVar107;
        fVar77 = local_1928._8_4_ * fVar192 +
                 local_1928._40_4_ * fVar229 + local_1928._24_4_ * fVar77;
        fVar192 = local_1928._12_4_ * fVar194 +
                  local_1928._44_4_ * fVar232 + local_1928._28_4_ * fVar123;
        auVar111 = vrcpps_avx(auVar87);
        fVar9 = auVar111._0_4_;
        auVar127._0_4_ = auVar87._0_4_ * fVar9;
        fVar183 = auVar111._4_4_;
        auVar127._4_4_ = auVar87._4_4_ * fVar183;
        fVar107 = auVar111._8_4_;
        auVar127._8_4_ = auVar87._8_4_ * fVar107;
        fVar190 = auVar111._12_4_;
        auVar127._12_4_ = auVar87._12_4_ * fVar190;
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar147,auVar127);
        local_18f8._0_4_ = (fVar54 + fVar54) * (fVar9 + fVar9 * auVar111._0_4_);
        local_18f8._4_4_ = (fVar75 + fVar75) * (fVar183 + fVar183 * auVar111._4_4_);
        local_18f8._8_4_ = (fVar77 + fVar77) * (fVar107 + fVar107 * auVar111._8_4_);
        local_18f8._12_4_ = (fVar192 + fVar192) * (fVar190 + fVar190 * auVar111._12_4_);
        auVar111 = vcmpps_avx(local_18f8,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar112 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_18f8,2);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar112 = vcmpps_avx(auVar87,ZEXT816(0) << 0x20,4);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar72 = vandps_avx(auVar72,local_1ae8);
        auVar111 = vpslld_avx(auVar111,0x1f);
        auVar112 = vpsrad_avx(auVar111,0x1f);
        auVar111 = auVar72 & auVar112;
        if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar111[0xf]) goto LAB_00ec2612;
        auVar72 = vandps_avx(auVar112,auVar72);
        pGVar7 = (context->scene->geometries).items[uVar3].ptr;
        uVar1 = pGVar7->mask;
        auVar113._4_4_ = uVar1;
        auVar113._0_4_ = uVar1;
        auVar113._8_4_ = uVar1;
        auVar113._12_4_ = uVar1;
        auVar111 = vandps_avx(auVar113,*(undefined1 (*) [16])(ray + 0x90));
        auVar111 = vpcmpeqd_avx(auVar111,ZEXT816(0) << 0x20);
        auVar112 = auVar72 & ~auVar111;
        auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          auVar72 = vandnps_avx(auVar111,auVar72);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar111 = vrcpps_avx(auVar201);
            fVar9 = auVar111._0_4_;
            auVar118._0_4_ = auVar201._0_4_ * fVar9;
            fVar183 = auVar111._4_4_;
            auVar118._4_4_ = auVar201._4_4_ * fVar183;
            fVar107 = auVar111._8_4_;
            auVar118._8_4_ = auVar201._8_4_ * fVar107;
            fVar190 = auVar111._12_4_;
            auVar118._12_4_ = auVar201._12_4_ * fVar190;
            auVar152._8_4_ = 0x3f800000;
            auVar152._0_8_ = 0x3f8000003f800000;
            auVar152._12_4_ = 0x3f800000;
            auVar111 = vsubps_avx(auVar152,auVar118);
            auVar94._0_4_ = fVar9 + fVar9 * auVar111._0_4_;
            auVar94._4_4_ = fVar183 + fVar183 * auVar111._4_4_;
            auVar94._8_4_ = fVar107 + fVar107 * auVar111._8_4_;
            auVar94._12_4_ = fVar190 + fVar190 * auVar111._12_4_;
            auVar119._8_4_ = 0x219392ef;
            auVar119._0_8_ = 0x219392ef219392ef;
            auVar119._12_4_ = 0x219392ef;
            auVar71 = vcmpps_avx(auVar71,auVar119,5);
            auVar71 = vandps_avx(auVar71,auVar94);
            auVar120._0_4_ = auVar71._0_4_ * auVar209._0_4_;
            auVar120._4_4_ = auVar71._4_4_ * auVar209._4_4_;
            auVar120._8_4_ = auVar71._8_4_ * auVar209._8_4_;
            auVar120._12_4_ = auVar71._12_4_ * auVar209._12_4_;
            auVar111 = vminps_avx(auVar120,auVar152);
            auVar95._0_4_ = auVar71._0_4_ * auVar126._0_4_;
            auVar95._4_4_ = auVar71._4_4_ * auVar126._4_4_;
            auVar95._8_4_ = auVar71._8_4_ * auVar126._8_4_;
            auVar95._12_4_ = auVar71._12_4_ * auVar126._12_4_;
            auVar71 = vminps_avx(auVar95,auVar152);
            auVar112 = vsubps_avx(auVar152,auVar111);
            auVar138 = vsubps_avx(auVar152,auVar71);
            auVar15._8_8_ = uVar23;
            auVar15._0_8_ = uVar22;
            local_18d8 = vblendvps_avx(auVar111,auVar112,auVar15);
            local_18e8 = vblendvps_avx(auVar71,auVar138,auVar15);
            args.valid = (int *)&Ng;
            args.geometryUserPtr = &t;
            args.context = (RTCRayQueryContext *)&v;
            args.ray = (RTCRayN *)&u;
            std::
            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
            ::
            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&local_1928.field_0);
            local_18c8 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
            local_18d8 = vpshufd_avx(ZEXT416(uVar27),0);
            vcmpps_avx(ZEXT1632(local_18c8),ZEXT1632(local_18c8),0xf);
            uStack_18b4 = context->user->instID[0];
            local_18b8 = uStack_18b4;
            uStack_18b0 = uStack_18b4;
            uStack_18ac = uStack_18b4;
            uStack_18a8 = context->user->instPrimID[0];
            uStack_18a4 = uStack_18a8;
            uStack_18a0 = uStack_18a8;
            uStack_189c = uStack_18a8;
            auVar71 = *(undefined1 (*) [16])(ray + 0x80);
            auVar111 = vblendvps_avx(auVar71,(undefined1  [16])t.field_0,auVar72);
            *(undefined1 (*) [16])(ray + 0x80) = auVar111;
            args.valid = (int *)local_1a88;
            args.geometryUserPtr = pGVar7->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&local_1928;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            local_1a88 = auVar72;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar7->occlusionFilterN)(&args);
            }
            if (local_1a88 == (undefined1  [16])0x0) {
              auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar72 = auVar72 ^ _DAT_01f46b70;
              auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            }
            else {
              p_Var8 = context->args->filter;
              if (p_Var8 == (RTCFilterFunctionN)0x0) {
                auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var8)(&args);
                  auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
              }
              auVar111 = vpcmpeqd_avx(local_1a88,_DAT_01f45a50);
              auVar72 = auVar111 ^ _DAT_01f46b70;
              auVar99._8_4_ = 0xff800000;
              auVar99._0_8_ = 0xff800000ff800000;
              auVar99._12_4_ = 0xff800000;
              auVar111 = vblendvps_avx(auVar99,*(undefined1 (*) [16])(args.ray + 0x80),auVar111);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
            }
            auVar111 = vpslld_avx(auVar72,0x1f);
            auVar72 = vpsrad_avx(auVar111,0x1f);
            auVar71 = vblendvps_avx(auVar71,*(undefined1 (*) [16])local_1a70,auVar111);
            *(undefined1 (*) [16])local_1a70 = auVar71;
          }
          local_1ae8 = vpandn_avx(auVar72,local_1ae8);
        }
      }
      if ((((local_1ae8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1ae8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1ae8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1ae8[0xf]) break;
      auVar71 = *(undefined1 (*) [16])ray;
      auVar72 = *(undefined1 (*) [16])(ray + 0x10);
      auVar111 = *(undefined1 (*) [16])(ray + 0x20);
      auVar18._4_4_ = fVar166;
      auVar18._0_4_ = fVar166;
      auVar18._8_4_ = fVar166;
      auVar18._12_4_ = fVar166;
      auVar112 = vsubps_avx(auVar18,auVar71);
      auVar17._4_4_ = fVar175;
      auVar17._0_4_ = fVar175;
      auVar17._8_4_ = fVar175;
      auVar17._12_4_ = fVar175;
      auVar138 = vsubps_avx(auVar17,auVar72);
      auVar16._4_4_ = fVar176;
      auVar16._0_4_ = fVar176;
      auVar16._8_4_ = fVar176;
      auVar16._12_4_ = fVar176;
      auVar156 = vsubps_avx(auVar16,auVar111);
      auVar157 = vsubps_avx(auVar235,auVar71);
      auVar158 = vsubps_avx(auVar140,auVar72);
      auVar185 = vsubps_avx(auVar168,auVar111);
      auVar71 = vsubps_avx(auVar171,auVar71);
      auVar72 = vsubps_avx(auVar57,auVar72);
      auVar111 = vsubps_avx(auVar82,auVar111);
      auVar197 = vsubps_avx(auVar71,auVar112);
      auVar198 = vsubps_avx(auVar72,auVar138);
      auVar219 = vsubps_avx(auVar111,auVar156);
      fVar166 = auVar138._0_4_;
      fVar107 = auVar72._0_4_ + fVar166;
      fVar175 = auVar138._4_4_;
      fVar77 = auVar72._4_4_ + fVar175;
      fVar176 = auVar138._8_4_;
      fVar123 = auVar72._8_4_ + fVar176;
      fVar9 = auVar138._12_4_;
      fVar54 = auVar72._12_4_ + fVar9;
      fVar234 = auVar156._0_4_;
      fVar75 = fVar234 + auVar111._0_4_;
      fVar238 = auVar156._4_4_;
      fVar76 = fVar238 + auVar111._4_4_;
      fVar239 = auVar156._8_4_;
      fVar78 = fVar239 + auVar111._8_4_;
      fVar240 = auVar156._12_4_;
      fVar180 = fVar240 + auVar111._12_4_;
      fVar183 = auVar219._0_4_;
      auVar210._0_4_ = fVar107 * fVar183;
      fVar190 = auVar219._4_4_;
      auVar210._4_4_ = fVar77 * fVar190;
      fVar192 = auVar219._8_4_;
      auVar210._8_4_ = fVar123 * fVar192;
      fVar194 = auVar219._12_4_;
      auVar210._12_4_ = fVar54 * fVar194;
      fVar223 = auVar198._0_4_;
      auVar220._0_4_ = fVar223 * fVar75;
      fVar225 = auVar198._4_4_;
      auVar220._4_4_ = fVar225 * fVar76;
      fVar226 = auVar198._8_4_;
      auVar220._8_4_ = fVar226 * fVar78;
      fVar227 = auVar198._12_4_;
      auVar220._12_4_ = fVar227 * fVar180;
      auVar198 = vsubps_avx(auVar220,auVar210);
      fVar196 = auVar112._0_4_;
      fVar208 = fVar196 + auVar71._0_4_;
      fVar204 = auVar112._4_4_;
      fVar215 = fVar204 + auVar71._4_4_;
      fVar205 = auVar112._8_4_;
      fVar217 = fVar205 + auVar71._8_4_;
      fVar206 = auVar112._12_4_;
      fVar179 = fVar206 + auVar71._12_4_;
      fVar79 = auVar197._0_4_;
      auVar174._0_4_ = fVar79 * fVar75;
      fVar51 = auVar197._4_4_;
      auVar174._4_4_ = fVar51 * fVar76;
      fVar53 = auVar197._8_4_;
      auVar174._8_4_ = fVar53 * fVar78;
      fVar121 = auVar197._12_4_;
      auVar174._12_4_ = fVar121 * fVar180;
      auVar221._0_4_ = fVar208 * fVar183;
      auVar221._4_4_ = fVar215 * fVar190;
      auVar221._8_4_ = fVar217 * fVar192;
      auVar221._12_4_ = fVar179 * fVar194;
      auVar197 = vsubps_avx(auVar221,auVar174);
      auVar211._0_4_ = fVar208 * fVar223;
      auVar211._4_4_ = fVar215 * fVar225;
      auVar211._8_4_ = fVar217 * fVar226;
      auVar211._12_4_ = fVar179 * fVar227;
      auVar114._0_4_ = fVar79 * fVar107;
      auVar114._4_4_ = fVar51 * fVar77;
      auVar114._8_4_ = fVar53 * fVar123;
      auVar114._12_4_ = fVar121 * fVar54;
      auVar219 = vsubps_avx(auVar114,auVar211);
      fVar75 = *(float *)(ray + 0x60);
      fVar76 = *(float *)(ray + 100);
      fVar78 = *(float *)(ray + 0x68);
      auVar20 = *(undefined1 (*) [12])(ray + 0x60);
      fVar180 = *(float *)(ray + 0x6c);
      auVar19 = *(undefined1 (*) [12])(ray + 0x50);
      fVar208 = *(float *)(ray + 0x5c);
      fVar215 = *(float *)(ray + 0x40);
      fVar217 = *(float *)(ray + 0x44);
      fVar179 = *(float *)(ray + 0x48);
      fVar207 = *(float *)(ray + 0x4c);
      local_1af8._0_4_ =
           fVar215 * auVar198._0_4_ +
           fVar75 * auVar219._0_4_ + *(float *)(ray + 0x50) * auVar197._0_4_;
      local_1af8._4_4_ =
           fVar217 * auVar198._4_4_ +
           fVar76 * auVar219._4_4_ + *(float *)(ray + 0x54) * auVar197._4_4_;
      fStack_1af0 = fVar179 * auVar198._8_4_ +
                    fVar78 * auVar219._8_4_ + *(float *)(ray + 0x58) * auVar197._8_4_;
      fStack_1aec = fVar207 * auVar198._12_4_ +
                    fVar180 * auVar219._12_4_ + fVar208 * auVar197._12_4_;
      auVar138 = vsubps_avx(auVar138,auVar158);
      auVar156 = vsubps_avx(auVar156,auVar185);
      fVar39 = auVar158._0_4_ + fVar166;
      fVar52 = auVar158._4_4_ + fVar175;
      fVar106 = auVar158._8_4_ + fVar176;
      fVar122 = auVar158._12_4_ + fVar9;
      fVar214 = fVar234 + auVar185._0_4_;
      fVar216 = fVar238 + auVar185._4_4_;
      fVar218 = fVar239 + auVar185._8_4_;
      fVar105 = fVar240 + auVar185._12_4_;
      fVar107 = auVar156._0_4_;
      auVar237._0_4_ = fVar39 * fVar107;
      fVar77 = auVar156._4_4_;
      auVar237._4_4_ = fVar52 * fVar77;
      fVar123 = auVar156._8_4_;
      auVar237._8_4_ = fVar106 * fVar123;
      fVar54 = auVar156._12_4_;
      auVar237._12_4_ = fVar122 * fVar54;
      fVar137 = auVar138._0_4_;
      auVar128._0_4_ = fVar137 * fVar214;
      fVar154 = auVar138._4_4_;
      auVar128._4_4_ = fVar154 * fVar216;
      fVar177 = auVar138._8_4_;
      auVar128._8_4_ = fVar177 * fVar218;
      fVar181 = auVar138._12_4_;
      auVar128._12_4_ = fVar181 * fVar105;
      auVar138 = vsubps_avx(auVar128,auVar237);
      auVar112 = vsubps_avx(auVar112,auVar157);
      fVar229 = auVar112._0_4_;
      auVar88._0_4_ = fVar229 * fVar214;
      fVar231 = auVar112._4_4_;
      auVar88._4_4_ = fVar231 * fVar216;
      fVar232 = auVar112._8_4_;
      auVar88._8_4_ = fVar232 * fVar218;
      fVar233 = auVar112._12_4_;
      auVar88._12_4_ = fVar233 * fVar105;
      fVar214 = fVar196 + auVar157._0_4_;
      fVar216 = fVar204 + auVar157._4_4_;
      fVar218 = fVar205 + auVar157._8_4_;
      fVar105 = fVar206 + auVar157._12_4_;
      auVar212._0_4_ = fVar214 * fVar107;
      auVar212._4_4_ = fVar216 * fVar77;
      auVar212._8_4_ = fVar218 * fVar123;
      auVar212._12_4_ = fVar105 * fVar54;
      auVar112 = vsubps_avx(auVar212,auVar88);
      auVar202._0_4_ = fVar214 * fVar137;
      auVar202._4_4_ = fVar216 * fVar154;
      auVar202._8_4_ = fVar218 * fVar177;
      auVar202._12_4_ = fVar105 * fVar181;
      auVar115._0_4_ = fVar229 * fVar39;
      auVar115._4_4_ = fVar231 * fVar52;
      auVar115._8_4_ = fVar232 * fVar106;
      auVar115._12_4_ = fVar233 * fVar122;
      auVar156 = vsubps_avx(auVar115,auVar202);
      local_1ac8 = auVar19._0_4_;
      fStack_1ac4 = auVar19._4_4_;
      fStack_1ac0 = auVar19._8_4_;
      auVar203._0_4_ =
           fVar215 * auVar138._0_4_ + fVar75 * auVar156._0_4_ + local_1ac8 * auVar112._0_4_;
      auVar203._4_4_ =
           fVar217 * auVar138._4_4_ + fVar76 * auVar156._4_4_ + fStack_1ac4 * auVar112._4_4_;
      auVar203._8_4_ =
           fVar179 * auVar138._8_4_ + fVar78 * auVar156._8_4_ + fStack_1ac0 * auVar112._8_4_;
      auVar203._12_4_ =
           fVar207 * auVar138._12_4_ + fVar180 * auVar156._12_4_ + fVar208 * auVar112._12_4_;
      auVar112 = vsubps_avx(auVar157,auVar71);
      fVar214 = auVar157._0_4_ + auVar71._0_4_;
      fVar216 = auVar157._4_4_ + auVar71._4_4_;
      fVar218 = auVar157._8_4_ + auVar71._8_4_;
      fVar105 = auVar157._12_4_ + auVar71._12_4_;
      auVar71 = vsubps_avx(auVar158,auVar72);
      fVar39 = auVar158._0_4_ + auVar72._0_4_;
      fVar52 = auVar158._4_4_ + auVar72._4_4_;
      fVar106 = auVar158._8_4_ + auVar72._8_4_;
      fVar122 = auVar158._12_4_ + auVar72._12_4_;
      auVar72 = vsubps_avx(auVar185,auVar111);
      fVar102 = auVar185._0_4_ + auVar111._0_4_;
      fVar103 = auVar185._4_4_ + auVar111._4_4_;
      fVar104 = auVar185._8_4_ + auVar111._8_4_;
      fVar136 = auVar185._12_4_ + auVar111._12_4_;
      fVar184 = auVar72._0_4_;
      auVar148._0_4_ = fVar184 * fVar39;
      fVar191 = auVar72._4_4_;
      auVar148._4_4_ = fVar191 * fVar52;
      fVar193 = auVar72._8_4_;
      auVar148._8_4_ = fVar193 * fVar106;
      fVar195 = auVar72._12_4_;
      auVar148._12_4_ = fVar195 * fVar122;
      fVar153 = auVar71._0_4_;
      auVar164._0_4_ = fVar153 * fVar102;
      fVar155 = auVar71._4_4_;
      auVar164._4_4_ = fVar155 * fVar103;
      fVar178 = auVar71._8_4_;
      auVar164._8_4_ = fVar178 * fVar104;
      fVar182 = auVar71._12_4_;
      auVar164._12_4_ = fVar182 * fVar136;
      auVar71 = vsubps_avx(auVar164,auVar148);
      fVar124 = auVar112._0_4_;
      auVar129._0_4_ = fVar124 * fVar102;
      fVar102 = auVar112._4_4_;
      auVar129._4_4_ = fVar102 * fVar103;
      fVar103 = auVar112._8_4_;
      auVar129._8_4_ = fVar103 * fVar104;
      fVar104 = auVar112._12_4_;
      auVar129._12_4_ = fVar104 * fVar136;
      auVar165._0_4_ = fVar184 * fVar214;
      auVar165._4_4_ = fVar191 * fVar216;
      auVar165._8_4_ = fVar193 * fVar218;
      auVar165._12_4_ = fVar195 * fVar105;
      auVar72 = vsubps_avx(auVar165,auVar129);
      auVar63._0_4_ = fVar214 * fVar153;
      auVar63._4_4_ = fVar216 * fVar155;
      auVar63._8_4_ = fVar218 * fVar178;
      auVar63._12_4_ = fVar105 * fVar182;
      auVar89._0_4_ = fVar124 * fVar39;
      auVar89._4_4_ = fVar102 * fVar52;
      auVar89._8_4_ = fVar103 * fVar106;
      auVar89._12_4_ = fVar104 * fVar122;
      auVar111 = vsubps_avx(auVar89,auVar63);
      auVar64._0_4_ = fVar215 * auVar71._0_4_ + fVar75 * auVar111._0_4_ + local_1ac8 * auVar72._0_4_
      ;
      auVar64._4_4_ =
           fVar217 * auVar71._4_4_ + fVar76 * auVar111._4_4_ + fStack_1ac4 * auVar72._4_4_;
      auVar64._8_4_ =
           fVar179 * auVar71._8_4_ + fVar78 * auVar111._8_4_ + fStack_1ac0 * auVar72._8_4_;
      auVar64._12_4_ =
           fVar207 * auVar71._12_4_ + fVar180 * auVar111._12_4_ + fVar208 * auVar72._12_4_;
      auVar130._0_4_ = auVar64._0_4_ + auVar203._0_4_ + (float)local_1af8._0_4_;
      auVar130._4_4_ = auVar64._4_4_ + auVar203._4_4_ + (float)local_1af8._4_4_;
      auVar130._8_4_ = auVar64._8_4_ + auVar203._8_4_ + fStack_1af0;
      auVar130._12_4_ = auVar64._12_4_ + auVar203._12_4_ + fStack_1aec;
      auVar71 = vminps_avx(_local_1af8,auVar203);
      auVar72 = vminps_avx(auVar71,auVar64);
      auVar213._8_4_ = 0x7fffffff;
      auVar213._0_8_ = 0x7fffffff7fffffff;
      auVar213._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx(auVar213,auVar130);
      auVar131._0_4_ = auVar71._0_4_ * 1.1920929e-07;
      auVar131._4_4_ = auVar71._4_4_ * 1.1920929e-07;
      auVar131._8_4_ = auVar71._8_4_ * 1.1920929e-07;
      auVar131._12_4_ = auVar71._12_4_ * 1.1920929e-07;
      uVar31 = CONCAT44(auVar131._4_4_,auVar131._0_4_);
      auVar149._0_8_ = uVar31 ^ 0x8000000080000000;
      auVar149._8_4_ = -auVar131._8_4_;
      auVar149._12_4_ = -auVar131._12_4_;
      auVar72 = vcmpps_avx(auVar72,auVar149,5);
      auVar111 = vmaxps_avx(_local_1af8,auVar203);
      auVar111 = vmaxps_avx(auVar111,auVar64);
      auVar111 = vcmpps_avx(auVar111,auVar131,2);
      auVar72 = vorps_avx(auVar72,auVar111);
      auVar111 = local_1ae8 & auVar72;
      if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar111[0xf]
         ) {
LAB_00ec2932:
        auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar65._0_4_ = fVar137 * fVar183;
        auVar65._4_4_ = fVar154 * fVar190;
        auVar65._8_4_ = fVar177 * fVar192;
        auVar65._12_4_ = fVar181 * fVar194;
        auVar90._0_4_ = fVar223 * fVar107;
        auVar90._4_4_ = fVar225 * fVar77;
        auVar90._8_4_ = fVar226 * fVar123;
        auVar90._12_4_ = fVar227 * fVar54;
        auVar138 = vsubps_avx(auVar90,auVar65);
        auVar132._0_4_ = fVar107 * fVar153;
        auVar132._4_4_ = fVar77 * fVar155;
        auVar132._8_4_ = fVar123 * fVar178;
        auVar132._12_4_ = fVar54 * fVar182;
        auVar150._0_4_ = fVar137 * fVar184;
        auVar150._4_4_ = fVar154 * fVar191;
        auVar150._8_4_ = fVar177 * fVar193;
        auVar150._12_4_ = fVar181 * fVar195;
        auVar156 = vsubps_avx(auVar150,auVar132);
        auVar111 = vandps_avx(auVar65,auVar213);
        auVar112 = vandps_avx(auVar132,auVar213);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        auVar66._0_4_ = fVar229 * fVar184;
        auVar66._4_4_ = fVar231 * fVar191;
        auVar66._8_4_ = fVar232 * fVar193;
        auVar66._12_4_ = fVar233 * fVar195;
        auVar91._0_4_ = fVar229 * fVar183;
        auVar91._4_4_ = fVar231 * fVar190;
        auVar91._8_4_ = fVar232 * fVar192;
        auVar91._12_4_ = fVar233 * fVar194;
        auVar133._0_4_ = fVar79 * fVar107;
        auVar133._4_4_ = fVar51 * fVar77;
        auVar133._8_4_ = fVar53 * fVar123;
        auVar133._12_4_ = fVar121 * fVar54;
        auVar138 = vsubps_avx(auVar91,auVar133);
        auVar151._0_4_ = fVar107 * fVar124;
        auVar151._4_4_ = fVar77 * fVar102;
        auVar151._8_4_ = fVar123 * fVar103;
        auVar151._12_4_ = fVar54 * fVar104;
        auVar156 = vsubps_avx(auVar151,auVar66);
        auVar111 = vandps_avx(auVar133,auVar213);
        auVar112 = vandps_avx(auVar66,auVar213);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        auVar67._0_4_ = fVar137 * fVar124;
        auVar67._4_4_ = fVar154 * fVar102;
        auVar67._8_4_ = fVar177 * fVar103;
        auVar67._12_4_ = fVar181 * fVar104;
        auVar92._0_4_ = fVar79 * fVar137;
        auVar92._4_4_ = fVar51 * fVar154;
        auVar92._8_4_ = fVar53 * fVar177;
        auVar92._12_4_ = fVar121 * fVar181;
        auVar116._0_4_ = fVar229 * fVar223;
        auVar116._4_4_ = fVar231 * fVar225;
        auVar116._8_4_ = fVar232 * fVar226;
        auVar116._12_4_ = fVar233 * fVar227;
        auVar49._0_4_ = fVar229 * fVar153;
        auVar49._4_4_ = fVar231 * fVar155;
        auVar49._8_4_ = fVar232 * fVar178;
        auVar49._12_4_ = fVar233 * fVar182;
        auVar138 = vsubps_avx(auVar92,auVar116);
        auVar156 = vsubps_avx(auVar49,auVar67);
        auVar111 = vandps_avx(auVar116,auVar213);
        auVar112 = vandps_avx(auVar67,auVar213);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1928.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar156,auVar138,auVar111);
        local_1a58 = auVar20._0_4_;
        fStack_1a54 = auVar20._4_4_;
        fStack_1a50 = auVar20._8_4_;
        fVar183 = fVar215 * local_1928._0_4_ +
                  local_1928._32_4_ * local_1a58 + local_1928._16_4_ * local_1ac8;
        fVar107 = fVar217 * local_1928._4_4_ +
                  local_1928._36_4_ * fStack_1a54 + local_1928._20_4_ * fStack_1ac4;
        fVar190 = fVar179 * local_1928._8_4_ +
                  local_1928._40_4_ * fStack_1a50 + local_1928._24_4_ * fStack_1ac0;
        fVar77 = fVar207 * local_1928._12_4_ +
                 local_1928._44_4_ * fVar180 + local_1928._28_4_ * fVar208;
        auVar68._0_4_ = fVar183 + fVar183;
        auVar68._4_4_ = fVar107 + fVar107;
        auVar68._8_4_ = fVar190 + fVar190;
        auVar68._12_4_ = fVar77 + fVar77;
        fVar183 = local_1928._0_4_ * fVar196 +
                  local_1928._32_4_ * fVar234 + local_1928._16_4_ * fVar166;
        fVar107 = local_1928._4_4_ * fVar204 +
                  local_1928._36_4_ * fVar238 + local_1928._20_4_ * fVar175;
        fVar190 = local_1928._8_4_ * fVar205 +
                  local_1928._40_4_ * fVar239 + local_1928._24_4_ * fVar176;
        fVar77 = local_1928._12_4_ * fVar206 +
                 local_1928._44_4_ * fVar240 + local_1928._28_4_ * fVar9;
        auVar111 = vrcpps_avx(auVar68);
        fVar166 = auVar111._0_4_;
        auVar117._0_4_ = auVar68._0_4_ * fVar166;
        fVar175 = auVar111._4_4_;
        auVar117._4_4_ = auVar68._4_4_ * fVar175;
        fVar176 = auVar111._8_4_;
        auVar117._8_4_ = auVar68._8_4_ * fVar176;
        fVar9 = auVar111._12_4_;
        auVar117._12_4_ = auVar68._12_4_ * fVar9;
        auVar134._8_4_ = 0x3f800000;
        auVar134._0_8_ = 0x3f8000003f800000;
        auVar134._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar134,auVar117);
        local_18f8._0_4_ = (fVar183 + fVar183) * (fVar166 + fVar166 * auVar111._0_4_);
        local_18f8._4_4_ = (fVar107 + fVar107) * (fVar175 + fVar175 * auVar111._4_4_);
        local_18f8._8_4_ = (fVar190 + fVar190) * (fVar176 + fVar176 * auVar111._8_4_);
        local_18f8._12_4_ = (fVar77 + fVar77) * (fVar9 + fVar9 * auVar111._12_4_);
        auVar111 = vcmpps_avx(local_18f8,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar112 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_18f8,2);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar112 = vcmpps_avx(auVar68,ZEXT816(0) << 0x20,4);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar72 = vandps_avx(auVar72,local_1ae8);
        auVar111 = vpslld_avx(auVar111,0x1f);
        auVar112 = vpsrad_avx(auVar111,0x1f);
        auVar111 = auVar72 & auVar112;
        if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar111[0xf]) goto LAB_00ec2932;
        auVar72 = vandps_avx(auVar112,auVar72);
        uVar3 = *(uint *)(lVar37 + lVar38);
        pGVar7 = (context->scene->geometries).items[uVar3].ptr;
        uVar27 = pGVar7->mask;
        auVar93._4_4_ = uVar27;
        auVar93._0_4_ = uVar27;
        auVar93._8_4_ = uVar27;
        auVar93._12_4_ = uVar27;
        auVar111 = vandps_avx(auVar93,*(undefined1 (*) [16])(ray + 0x90));
        auVar111 = vpcmpeqd_avx(auVar111,ZEXT816(0) << 0x20);
        auVar112 = auVar72 & ~auVar111;
        auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          uVar27 = *(uint *)(lVar37 + 0x10 + lVar38);
          auVar72 = vandnps_avx(auVar111,auVar72);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar111 = vrcpps_avx(auVar130);
            fVar166 = auVar111._0_4_;
            auVar96._0_4_ = auVar130._0_4_ * fVar166;
            fVar175 = auVar111._4_4_;
            auVar96._4_4_ = auVar130._4_4_ * fVar175;
            fVar176 = auVar111._8_4_;
            auVar96._8_4_ = auVar130._8_4_ * fVar176;
            fVar9 = auVar111._12_4_;
            auVar96._12_4_ = auVar130._12_4_ * fVar9;
            auVar135._8_4_ = 0x3f800000;
            auVar135._0_8_ = 0x3f8000003f800000;
            auVar135._12_4_ = 0x3f800000;
            auVar111 = vsubps_avx(auVar135,auVar96);
            auVar69._0_4_ = fVar166 + fVar166 * auVar111._0_4_;
            auVar69._4_4_ = fVar175 + fVar175 * auVar111._4_4_;
            auVar69._8_4_ = fVar176 + fVar176 * auVar111._8_4_;
            auVar69._12_4_ = fVar9 + fVar9 * auVar111._12_4_;
            auVar97._8_4_ = 0x219392ef;
            auVar97._0_8_ = 0x219392ef219392ef;
            auVar97._12_4_ = 0x219392ef;
            auVar71 = vcmpps_avx(auVar71,auVar97,5);
            auVar71 = vandps_avx(auVar71,auVar69);
            auVar98._0_4_ = auVar71._0_4_ * (float)local_1af8._0_4_;
            auVar98._4_4_ = auVar71._4_4_ * (float)local_1af8._4_4_;
            auVar98._8_4_ = auVar71._8_4_ * fStack_1af0;
            auVar98._12_4_ = auVar71._12_4_ * fStack_1aec;
            auVar111 = vminps_avx(auVar98,auVar135);
            auVar70._0_4_ = auVar71._0_4_ * auVar203._0_4_;
            auVar70._4_4_ = auVar71._4_4_ * auVar203._4_4_;
            auVar70._8_4_ = auVar71._8_4_ * auVar203._8_4_;
            auVar70._12_4_ = auVar71._12_4_ * auVar203._12_4_;
            auVar71 = vminps_avx(auVar70,auVar135);
            auVar112 = vsubps_avx(auVar135,auVar111);
            auVar138 = vsubps_avx(auVar135,auVar71);
            auVar14._8_8_ = uVar25;
            auVar14._0_8_ = uVar24;
            local_18d8 = vblendvps_avx(auVar111,auVar112,auVar14);
            local_18e8 = vblendvps_avx(auVar71,auVar138,auVar14);
            args.valid = (int *)&Ng;
            args.geometryUserPtr = &t;
            args.context = (RTCRayQueryContext *)&v;
            args.ray = (RTCRayN *)&u;
            std::
            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
            ::
            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&local_1928.field_0);
            local_18c8 = vpshufd_avx(ZEXT416(uVar3),0);
            auVar71 = ZEXT416(uVar27);
            local_18d8 = vshufps_avx(auVar71,auVar71,0);
            vcmpps_avx(ZEXT1632(local_18c8),ZEXT1632(local_18c8),0xf);
            uStack_18b4 = context->user->instID[0];
            local_18b8 = uStack_18b4;
            uStack_18b0 = uStack_18b4;
            uStack_18ac = uStack_18b4;
            uStack_18a8 = context->user->instPrimID[0];
            uStack_18a4 = uStack_18a8;
            uStack_18a0 = uStack_18a8;
            uStack_189c = uStack_18a8;
            auVar71 = *(undefined1 (*) [16])(ray + 0x80);
            auVar111 = vblendvps_avx(auVar71,(undefined1  [16])t.field_0,auVar72);
            *(undefined1 (*) [16])(ray + 0x80) = auVar111;
            args.valid = (int *)local_1a88;
            args.geometryUserPtr = pGVar7->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&local_1928;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            local_1a88 = auVar72;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar7->occlusionFilterN)(&args);
            }
            if (local_1a88 == (undefined1  [16])0x0) {
              auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar72 = auVar72 ^ _DAT_01f46b70;
              auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            }
            else {
              p_Var8 = context->args->filter;
              if (p_Var8 == (RTCFilterFunctionN)0x0) {
                auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var8)(&args);
                  auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar222 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
              }
              auVar111 = vpcmpeqd_avx(local_1a88,_DAT_01f45a50);
              auVar72 = auVar111 ^ _DAT_01f46b70;
              auVar100._8_4_ = 0xff800000;
              auVar100._0_8_ = 0xff800000ff800000;
              auVar100._12_4_ = 0xff800000;
              auVar111 = vblendvps_avx(auVar100,*(undefined1 (*) [16])(args.ray + 0x80),auVar111);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
            }
            auVar111 = vpslld_avx(auVar72,0x1f);
            auVar72 = vpsrad_avx(auVar111,0x1f);
            auVar71 = vblendvps_avx(auVar71,*(undefined1 (*) [16])local_1a70,auVar111);
            *(undefined1 (*) [16])local_1a70 = auVar71;
          }
          local_1ae8 = vpandn_avx(auVar72,local_1ae8);
        }
      }
      lVar38 = lVar38 + 4;
    } while ((((local_1ae8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (local_1ae8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (local_1ae8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             local_1ae8[0xf] < '\0');
    auVar74 = ZEXT1664(local_1a48);
    auVar72 = vandps_avx(local_1ae8,local_1a48);
    lVar30 = lVar30 + 1;
    lVar37 = lVar37 + 0x60;
    local_1ae8 = local_1a48 & local_1ae8;
    auVar71 = local_1a48;
    local_1a48 = auVar72;
  } while ((((local_1ae8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (local_1ae8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (local_1ae8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           local_1ae8[0xf] < '\0');
  auVar71 = vpcmpeqd_avx(auVar71,auVar71);
  auVar50._0_4_ = local_1a48._0_4_ ^ auVar71._0_4_;
  auVar50._4_4_ = local_1a48._4_4_ ^ auVar71._4_4_;
  auVar50._8_4_ = local_1a48._8_4_ ^ auVar71._8_4_;
  auVar50._12_4_ = local_1a48._12_4_ ^ auVar71._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar50,(undefined1  [16])terminated.field_0);
  auVar71 = auVar71 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf])
  goto LAB_00ec2f6a;
  auVar74 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar101._8_4_ = 0xff800000;
  auVar101._0_8_ = 0xff800000ff800000;
  auVar101._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar101,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ec1a09;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }